

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O1

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,ShiftLeftLogicalExpression *expression)

{
  undefined1 *puVar1;
  Expression *pEVar2;
  
  this->isExpression = true;
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"(",1);
  pEVar2 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," << ",4);
  pEVar2 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,")",1);
  return;
}

Assistant:

void CppPrinter::visit(ShiftLeftLogicalExpression* expression) {
    isExpression = true;

    output << "(";
    expression->getLeft()->accept(this);
    output << " << ";
    expression->getRight()->accept(this);
    output << ")";
}